

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavRestoreLayer(int layer)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  ImGuiWindow *pIVar3;
  
  pIVar2 = GImGui;
  GImGui->NavLayer = layer;
  if (layer == 0) {
    pIVar3 = pIVar2->NavWindow->NavLastChildNavWindow;
    if (pIVar3 == (ImGuiWindow *)0x0) {
      pIVar3 = pIVar2->NavWindow;
    }
    pIVar2->NavWindow = pIVar3;
    IVar1 = pIVar3->NavLastIds[0];
    if (IVar1 != 0) {
      if (pIVar3 != (ImGuiWindow *)0x0) {
        pIVar2->NavId = IVar1;
        pIVar3->NavLastIds[0] = IVar1;
        pIVar2->NavMousePosDirty = true;
        pIVar2->NavDisableHighlight = false;
        pIVar2->NavDisableMouseHover = true;
        return;
      }
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x81b,"void SetNavID(ImGuiID, int)");
    }
  }
  ImGui::NavInitWindow(pIVar2->NavWindow,true);
  return;
}

Assistant:

static void NavRestoreLayer(int layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    if (layer == 0 && g.NavWindow->NavLastIds[0] != 0)
        SetNavIDWithRectRel(g.NavWindow->NavLastIds[0], layer, g.NavWindow->NavRectRel[0]);
    else
        ImGui::NavInitWindow(g.NavWindow, true);
}